

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialnonce.cpp
# Opt level: O0

void __thiscall
ConfidentialNonce_Constractor_hex33_version0_Test::ConfidentialNonce_Constractor_hex33_version0_Test
          (ConfidentialNonce_Constractor_hex33_version0_Test *this)

{
  ConfidentialNonce_Constractor_hex33_version0_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__ConfidentialNonce_Constractor_hex33_version0_Test_00674768;
  return;
}

Assistant:

TEST(ConfidentialNonce, Constractor_hex33_version0) {
  // 33byte
  ConfidentialNonce nonce(
      "00c384a78ae89b9600a8d2b4ddb3090ba5dad224ff4b85e6868f2916ca64314ad9");
  EXPECT_STREQ(nonce.GetHex().c_str(), "");
  EXPECT_EQ(nonce.GetData().GetDataSize(), 0);
  EXPECT_EQ(nonce.HasBlinding(), false);
  EXPECT_TRUE(nonce.IsEmpty());
}